

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseOperatorName(State *state,int *arity)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  char *pcVar9;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  long lVar17;
  char *str;
  int iVar18;
  char *pcVar19;
  int *piVar20;
  
  iVar18 = state->recursion_depth;
  iVar16 = state->steps;
  state->recursion_depth = iVar18 + 1;
  state->steps = iVar16 + 1;
  if ((0x1ffff < iVar16 || 0xff < iVar18) ||
     (bVar14 = AtLeastNumCharsRemaining(state->mangled_begin + (state->parse_state).mangled_idx,2),
     !bVar14)) {
    bVar14 = false;
    goto LAB_0010513c;
  }
  pPVar1 = &state->parse_state;
  iVar18 = (state->parse_state).prev_name_idx;
  uVar8 = pPVar1->mangled_idx;
  uVar10 = pPVar1->out_cur_idx;
  uVar5 = *(uint *)&(state->parse_state).field_0xc;
  bVar14 = ParseTwoCharToken(state,"cv");
  if (bVar14) {
    MaybeAppend(state,"operator ");
    puVar2 = &(state->parse_state).field_0xc;
    *(uint *)puVar2 = *(uint *)puVar2 & 0x8000ffff;
    iVar16 = state->recursion_depth;
    iVar6 = state->steps;
    state->recursion_depth = iVar16 + 1;
    state->steps = iVar6 + 1;
    if (iVar6 < 0x20000 && iVar16 < 0x100) {
      iVar6 = pPVar1->mangled_idx;
      iVar11 = pPVar1->out_cur_idx;
      iVar12 = (state->parse_state).prev_name_idx;
      uVar13 = *(undefined4 *)&(state->parse_state).field_0xc;
      pcVar9 = state->mangled_begin;
      iVar16 = (state->parse_state).mangled_idx;
      do {
        bVar14 = ParseCharClass(state,"OPRCGrVK");
      } while (bVar14);
      pcVar19 = state->mangled_begin;
      iVar7 = (state->parse_state).mangled_idx;
      bVar14 = ParseType(state);
      if (bVar14) {
        pcVar19 = pcVar19 + iVar7;
switchD_00104fdf_caseD_4c:
        if (pcVar19 == pcVar9 + iVar16) goto LAB_0010514f;
        cVar3 = pcVar19[-1];
        pcVar19 = pcVar19 + -1;
        str = "*";
        switch(cVar3) {
        case 'K':
          str = " const";
          break;
        case 'L':
        case 'M':
        case 'N':
        case 'Q':
        case 'S':
        case 'T':
        case 'U':
          goto switchD_00104fdf_caseD_4c;
        case 'O':
          str = "&&";
          break;
        case 'P':
          break;
        case 'R':
          str = "&";
          break;
        case 'V':
          str = " volatile";
          break;
        default:
          if (cVar3 == 'C') {
            str = " _Complex";
          }
          else if (cVar3 == 'G') {
            str = " _Imaginary";
          }
          else {
            if (cVar3 != 'r') goto switchD_00104fdf_caseD_4c;
            str = " restrict";
          }
        }
        MaybeAppend(state,str);
        goto switchD_00104fdf_caseD_4c;
      }
      pPVar1->mangled_idx = iVar6;
      pPVar1->out_cur_idx = iVar11;
      (state->parse_state).prev_name_idx = iVar12;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar13;
      iVar16 = state->recursion_depth + -1;
    }
    state->recursion_depth = iVar16;
  }
  (state->parse_state).prev_name_idx = iVar18;
  pPVar1->mangled_idx = uVar8;
  pPVar1->out_cur_idx = uVar10;
  *(uint *)&(state->parse_state).field_0xc = uVar5;
  bVar14 = ParseTwoCharToken(state,"li");
  if (bVar14) {
    MaybeAppend(state,"operator\"\" ");
    bVar15 = ParseSourceName(state);
    bVar14 = true;
    if (bVar15) goto LAB_00105135;
  }
  (state->parse_state).prev_name_idx = iVar18;
  pPVar1->mangled_idx = uVar8;
  pPVar1->out_cur_idx = uVar10;
  *(uint *)&(state->parse_state).field_0xc = uVar5;
  bVar14 = ParseOneCharToken(state,'v');
  if ((bVar14) && (bVar14 = ParseDigit(state,arity), bVar14)) {
    bVar15 = ParseSourceName(state);
    bVar14 = true;
    if (bVar15) goto LAB_00105135;
  }
  (state->parse_state).prev_name_idx = iVar18;
  pPVar1->mangled_idx = uVar8;
  pPVar1->out_cur_idx = uVar10;
  *(uint *)&(state->parse_state).field_0xc = uVar5;
  lVar17 = (long)(state->parse_state).mangled_idx;
  cVar3 = state->mangled_begin[lVar17];
  if (((byte)(cVar3 + 0x9fU) < 0x1a) &&
     (bVar4 = state->mangled_begin[lVar17 + 1], (byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
    for (piVar20 = (int *)&DAT_0010a7f0; pcVar9 = *(char **)(piVar20 + -4), pcVar9 != (char *)0x0;
        piVar20 = piVar20 + 6) {
      if ((cVar3 == *pcVar9) && (bVar4 == pcVar9[1])) {
        if (arity != (int *)0x0) {
          *arity = *piVar20;
        }
        MaybeAppend(state,"operator");
        pcVar9 = *(char **)(piVar20 + -2);
        if ((byte)(*pcVar9 + 0x9fU) < 0x1a) {
          MaybeAppend(state," ");
        }
        MaybeAppend(state,pcVar9);
        (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 2;
        bVar14 = true;
        goto LAB_00105135;
      }
    }
  }
  bVar14 = false;
  goto LAB_00105135;
LAB_0010514f:
  state->recursion_depth = state->recursion_depth + -1;
  *(uint *)&(state->parse_state).field_0xc =
       *(uint *)&(state->parse_state).field_0xc & 0x8000ffff | uVar5 & 0x7fff0000;
  bVar14 = true;
  if (arity != (int *)0x0) {
    *arity = 1;
    bVar14 = true;
  }
LAB_00105135:
  iVar18 = state->recursion_depth + -1;
LAB_0010513c:
  state->recursion_depth = iVar18;
  return bVar14;
}

Assistant:

static bool ParseOperatorName(State *state, int *arity) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (!AtLeastNumCharsRemaining(RemainingInput(state), 2)) {
    return false;
  }
  // First check with "cv" (cast) case.
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "cv") && MaybeAppend(state, "operator ") &&
      EnterNestedName(state) && ParseConversionOperatorType(state) &&
      LeaveNestedName(state, copy.nest_level)) {
    if (arity != nullptr) {
      *arity = 1;
    }
    return true;
  }
  state->parse_state = copy;

  // Then user-defined literals.
  if (ParseTwoCharToken(state, "li") && MaybeAppend(state, "operator\"\" ") &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Then vendor extended operators.
  if (ParseOneCharToken(state, 'v') && ParseDigit(state, arity) &&
      ParseSourceName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Other operator names should start with a lower alphabet followed
  // by a lower/upper alphabet.
  if (!(IsLower(RemainingInput(state)[0]) &&
        IsAlpha(RemainingInput(state)[1]))) {
    return false;
  }
  // We may want to perform a binary search if we really need speed.
  const AbbrevPair *p;
  for (p = kOperatorList; p->abbrev != nullptr; ++p) {
    if (RemainingInput(state)[0] == p->abbrev[0] &&
        RemainingInput(state)[1] == p->abbrev[1]) {
      if (arity != nullptr) {
        *arity = p->arity;
      }
      MaybeAppend(state, "operator");
      if (IsLower(*p->real_name)) {  // new, delete, etc.
        MaybeAppend(state, " ");
      }
      MaybeAppend(state, p->real_name);
      state->parse_state.mangled_idx += 2;
      UpdateHighWaterMark(state);
      return true;
    }
  }
  return false;
}